

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O0

ostream * operator<<(ostream *os,Plane *item)

{
  ostream *poVar1;
  string local_38 [32];
  Plane *local_18;
  Plane *item_local;
  ostream *os_local;
  
  local_18 = item;
  item_local = (Plane *)os;
  poVar1 = std::operator<<(os,"plane name: ");
  poVar1 = std::operator<<(poVar1,(string *)local_18);
  poVar1 = std::operator<<(poVar1,"\ncategory: ");
  PLANE_CATE_convert_abi_cxx11_((int)local_38);
  poVar1 = std::operator<<(poVar1,local_38);
  poVar1 = std::operator<<(poVar1,"\nairSupremacy: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18->airSupremacy);
  poVar1 = std::operator<<(poVar1,"\ntorpedoAttack: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18->torpedoAtk);
  poVar1 = std::operator<<(poVar1,"\nbombAttack: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18->bombAtk);
  poVar1 = std::operator<<(poVar1,"\naccuracy");
  std::ostream::operator<<(poVar1,local_18->accuracy);
  std::__cxx11::string::~string(local_38);
  return (ostream *)item_local;
}

Assistant:

ostream &operator<<(ostream &os,Plane &item){
    os<<"plane name: "<<item.name<<"\ncategory: "<<PLANE_CATE_convert(item.category)<<"\nairSupremacy: "<<item.airSupremacy<<"\ntorpedoAttack: "<<item.torpedoAtk<<"\nbombAttack: "<<item.bombAtk<<"\naccuracy"<<item.accuracy;
    return os;
}